

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O1

longlong * __thiscall PrimitiveTestClass::FillValues<long_long*>(PrimitiveTestClass *this)

{
  longlong *plVar1;
  long lVar2;
  long lVar3;
  ulong uVar4;
  
  lVar3 = (long)this->SIZE;
  uVar4 = 0xffffffffffffffff;
  if (-1 < lVar3) {
    uVar4 = lVar3 * 8;
  }
  plVar1 = (longlong *)operator_new__(uVar4);
  if (lVar3 != 0) {
    lVar2 = 0;
    do {
      plVar1[lVar2] = 0xff;
      lVar2 = lVar2 + 1;
    } while (lVar3 != lVar2);
  }
  return plVar1;
}

Assistant:

T FillValues()
        {
            T ret = new typename std::remove_pointer<T>::type[SIZE];
            for (size_t i = 0; i < SIZE; i++)
            {
                ret[i] = 0xFF;
            }
            
            return ret;
        }